

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-utils.h
# Opt level: O3

NameSet * wasm::BranchUtils::BranchAccumulator::get
                    (NameSet *__return_storage_ptr__,Expression *tree)

{
  Module **__x;
  undefined1 auStack_128 [8];
  BranchAccumulator accumulator;
  Expression *tree_local;
  
  accumulator.branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&accumulator.branches;
  auStack_128 = (undefined1  [8])0x0;
  accumulator.
  super_PostWalker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>
  .
  super_Walker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>
  .replacep = (Expression **)0x0;
  accumulator.
  super_PostWalker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>
  .
  super_Walker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>
  .stack.fixed._M_elems[9].currp = (Expression **)0x0;
  accumulator.
  super_PostWalker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>
  .
  super_Walker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>::Task,_std::allocator<wasm::Walker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  accumulator.
  super_PostWalker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>
  .
  super_Walker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>::Task,_std::allocator<wasm::Walker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  accumulator.
  super_PostWalker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>
  .
  super_Walker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>::Task,_std::allocator<wasm::Walker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  accumulator.
  super_PostWalker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>
  .
  super_Walker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>
  .currFunction = (Function *)0x0;
  accumulator.branches._M_t._M_impl._0_4_ = 0;
  accumulator.branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  accumulator.branches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  accumulator.branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  accumulator.branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       accumulator.branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  accumulator.branches._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)tree;
  Walker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>
  ::walk((Walker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>
          *)auStack_128,
         (Expression **)&accumulator.branches._M_t._M_impl.super__Rb_tree_header._M_node_count);
  __x = &accumulator.
         super_PostWalker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>
         .
         super_Walker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>
         .currModule;
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::_Rb_tree(&__return_storage_ptr__->_M_t,
             (_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
              *)__x);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
               *)__x);
  if (accumulator.
      super_PostWalker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>
      .
      super_Walker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>
      .stack.fixed._M_elems[9].currp != (Expression **)0x0) {
    operator_delete(accumulator.
                    super_PostWalker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>
                    .
                    super_Walker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>
                    .stack.fixed._M_elems[9].currp,
                    (long)accumulator.
                          super_PostWalker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>
                          .
                          super_Walker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>
                          .stack.flexible.
                          super__Vector_base<wasm::Walker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>::Task,_std::allocator<wasm::Walker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)accumulator.
                          super_PostWalker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>
                          .
                          super_Walker<wasm::BranchUtils::BranchAccumulator,_wasm::UnifiedExpressionVisitor<wasm::BranchUtils::BranchAccumulator,_void>_>
                          .stack.fixed._M_elems[9].currp);
  }
  return __return_storage_ptr__;
}

Assistant:

static NameSet get(Expression* tree) {
    BranchAccumulator accumulator;
    accumulator.walk(tree);
    return accumulator.branches;
  }